

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Base.cpp
# Opt level: O3

void __thiscall
adios2::format::BP5Base::BP5BitfieldSet(BP5Base *this,BP5MetadataInfoStruct *MBase,int Bit)

{
  size_t *__ptr;
  ulong uVar1;
  
  uVar1 = (ulong)(long)Bit >> 6;
  __ptr = MBase->BitField;
  if (MBase->BitFieldCount <= uVar1) {
    __ptr = (size_t *)realloc(__ptr,uVar1 * 8 + 8);
    MBase->BitField = __ptr;
    memset(__ptr + MBase->BitFieldCount,0,(uVar1 - MBase->BitFieldCount) * 8 + 8);
    MBase->BitFieldCount = uVar1 + 1;
  }
  __ptr[uVar1] = __ptr[uVar1] | 1L << ((byte)Bit & 0x3f);
  return;
}

Assistant:

void BP5Base::BP5BitfieldSet(struct BP5MetadataInfoStruct *MBase, int Bit) const
{
    size_t Element = Bit / (sizeof(size_t) * 8);
    int ElementBit = Bit % (sizeof(size_t) * 8);
    if (static_cast<size_t>(Element) >= MBase->BitFieldCount)
    {
        MBase->BitField = (size_t *)realloc(MBase->BitField, sizeof(size_t) * (Element + 1));
        memset(MBase->BitField + MBase->BitFieldCount, 0,
               (Element - MBase->BitFieldCount + 1) * sizeof(size_t));
        MBase->BitFieldCount = Element + 1;
    }
    MBase->BitField[Element] |= ((size_t)1 << ElementBit);
}